

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O2

CURLcode libcurl_generate_mime(curl_mime *mime,int *mimeno)

{
  char cVar1;
  curl_mimepart *pcVar2;
  long lVar3;
  CURLcode CVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char *__s1;
  char *__ptr;
  uint uVar9;
  curl_mimepart **ppcVar10;
  int i;
  long local_38;
  
  easysrc_mime_count = easysrc_mime_count + 1;
  *mimeno = easysrc_mime_count;
  __ptr = (char *)0x0;
  CVar4 = easysrc_addf(&easysrc_decl,"curl_mime *mime%d;");
  if (CVar4 != CURLE_OK) {
LAB_00118bee:
    free(__ptr);
    return CVar4;
  }
  __ptr = (char *)0x0;
  CVar4 = easysrc_addf(&easysrc_data,"mime%d = NULL;",(ulong)(uint)*mimeno);
  if (CVar4 != CURLE_OK) goto LAB_00118bee;
  __ptr = (char *)0x0;
  CVar4 = easysrc_addf(&easysrc_code,"mime%d = curl_mime_init(hnd);",(ulong)(uint)*mimeno);
  if (CVar4 != CURLE_OK) goto LAB_00118bee;
  __ptr = (char *)0x0;
  CVar4 = easysrc_addf(&easysrc_clean,"curl_mime_free(mime%d);",(ulong)(uint)*mimeno);
  if (CVar4 != CURLE_OK) goto LAB_00118bee;
  CVar4 = easysrc_addf(&easysrc_clean,"mime%d = NULL;",(ulong)(uint)*mimeno);
  if (CVar4 != CURLE_OK) {
    __ptr = (char *)0x0;
    goto LAB_00118bee;
  }
  if (mime->firstpart == (curl_mimepart *)0x0) {
    __ptr = (char *)0x0;
    CVar4 = CURLE_OK;
    goto LAB_00118bee;
  }
  __ptr = (char *)0x0;
  CVar4 = easysrc_addf(&easysrc_decl,"curl_mimepart *part%d;",(ulong)(uint)*mimeno);
  if (CVar4 != CURLE_OK) goto LAB_00118bee;
  ppcVar10 = &mime->firstpart;
  __ptr = (char *)0x0;
LAB_00118c46:
  pcVar2 = *ppcVar10;
  CVar4 = CURLE_OK;
  if ((pcVar2 == (curl_mimepart *)0x0) ||
     (CVar4 = easysrc_addf(&easysrc_code,"part%d = curl_mime_addpart(mime%d);",(ulong)(uint)*mimeno)
     , CVar4 != CURLE_OK)) goto LAB_00118bee;
  pcVar8 = pcVar2->filename;
  switch(pcVar2->kind) {
  case MIMEKIND_DATA:
    pcVar7 = pcVar2->data;
    lVar6 = -1;
    do {
      lVar3 = lVar6 + 1;
      lVar6 = lVar6 + 1;
    } while (pcVar7[lVar3] != '\0');
    local_38 = pcVar2->datasize;
    if (pcVar2->datasize == lVar6) {
      local_38 = -1;
    }
    free(__ptr);
    __ptr = c_escape(pcVar7,pcVar2->datasize);
    if (__ptr == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (local_38 < 0) {
      CVar4 = easysrc_addf(&easysrc_code,"curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                           (ulong)(uint)*mimeno,__ptr);
    }
    else {
      CVar4 = easysrc_addf(&easysrc_code,"curl_mime_data(part%d, \"%s\", %ld);",(ulong)(uint)*mimeno
                           ,__ptr);
    }
    break;
  case MIMEKIND_FILE:
    free(__ptr);
    __ptr = c_escape(pcVar2->data,0xffffffffffffffff);
    if (__ptr == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar4 = easysrc_addf(&easysrc_code,"curl_mime_filedata(part%d, \"%s\");",(ulong)(uint)*mimeno,
                         __ptr);
    if (CVar4 != CURLE_OK) goto LAB_00118bee;
    if (pcVar8 != (char *)0x0) {
      pcVar7 = pcVar2->data;
      pcVar8 = pcVar2->data;
      do {
        do {
          __s1 = pcVar7;
          pcVar7 = pcVar8 + 1;
          cVar1 = *pcVar8;
          pcVar8 = pcVar7;
        } while (cVar1 == '/');
      } while ((cVar1 == '\\') || (pcVar7 = __s1, cVar1 != '\0'));
      pcVar7 = pcVar2->filename;
      if (pcVar7 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        iVar5 = strcmp(__s1,pcVar7);
        pcVar8 = (char *)0x0;
        if (iVar5 != 0) {
          pcVar8 = pcVar7;
        }
      }
      goto switchD_00118c89_default;
    }
    CVar4 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, NULL);",(ulong)(uint)*mimeno);
    if (CVar4 != CURLE_OK) goto LAB_00118bee;
    pcVar8 = (char *)0x0;
    goto switchD_00118c89_default;
  case MIMEKIND_CALLBACK:
    CVar4 = easysrc_addf(&easysrc_code,
                         "curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
                         (ulong)(uint)*mimeno);
    if (CVar4 != CURLE_OK) goto LAB_00118bee;
    CVar4 = easysrc_add(&easysrc_code,"                  (curl_seek_callback) fseek, NULL, stdin);")
    ;
    break;
  case MIMEKIND_MULTIPART:
    CVar4 = libcurl_generate_mime((curl_mime *)pcVar2->arg,&i);
    iVar5 = i;
    if ((CVar4 != CURLE_OK) ||
       (CVar4 = easysrc_addf(&easysrc_code,"curl_mime_subparts(part%d, mime%d);",
                             (ulong)(uint)*mimeno,(ulong)(uint)i), CVar4 != CURLE_OK))
    goto LAB_00118bee;
    CVar4 = easysrc_addf(&easysrc_code,"mime%d = NULL;",(ulong)(uint)iVar5);
    break;
  default:
    goto switchD_00118c89_default;
  }
  if (CVar4 != CURLE_OK) goto LAB_00118bee;
switchD_00118c89_default:
  if (pcVar2->encoder != (mime_encoder *)0x0) {
    free(__ptr);
    __ptr = c_escape(pcVar2->encoder->name,0xffffffffffffffff);
    if (__ptr == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar4 = easysrc_addf(&easysrc_code,"curl_mime_encoder(part%d, \"%s\");",(ulong)(uint)*mimeno,
                         __ptr);
    if (CVar4 != CURLE_OK) goto LAB_00118bee;
  }
  if (pcVar8 != (char *)0x0) {
    free(__ptr);
    __ptr = c_escape(pcVar8,0xffffffffffffffff);
    if (__ptr == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar4 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, \"%s\");",(ulong)(uint)*mimeno,
                         __ptr);
    if (CVar4 != CURLE_OK) goto LAB_00118bee;
  }
  if (pcVar2->name != (char *)0x0) {
    free(__ptr);
    __ptr = c_escape(pcVar2->name,0xffffffffffffffff);
    if (__ptr == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar4 = easysrc_addf(&easysrc_code,"curl_mime_name(part%d, \"%s\");",(ulong)(uint)*mimeno,__ptr)
    ;
    if (CVar4 != CURLE_OK) goto LAB_00118bee;
  }
  if (pcVar2->mimetype != (char *)0x0) {
    free(__ptr);
    __ptr = c_escape(pcVar2->mimetype,0xffffffffffffffff);
    if (__ptr == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar4 = easysrc_addf(&easysrc_code,"curl_mime_type(part%d, \"%s\");",(ulong)(uint)*mimeno,__ptr)
    ;
    if (CVar4 != CURLE_OK) goto LAB_00118bee;
  }
  if (pcVar2->userheaders != (curl_slist *)0x0) {
    uVar9 = pcVar2->flags;
    CVar4 = libcurl_generate_slist(pcVar2->userheaders,&i);
    iVar5 = i;
    if (CVar4 != CURLE_OK) goto LAB_00118bee;
    uVar9 = uVar9 & 1;
    CVar4 = easysrc_addf(&easysrc_code,"curl_mime_headers(part%d, slist%d, %d);",
                         (ulong)(uint)*mimeno,(ulong)(uint)i,(ulong)uVar9);
    if ((CVar4 != CURLE_OK) ||
       ((uVar9 != 0 &&
        (CVar4 = easysrc_addf(&easysrc_code,"slist%d = NULL;",iVar5), CVar4 != CURLE_OK))))
    goto LAB_00118bee;
  }
  ppcVar10 = &pcVar2->nextpart;
  goto LAB_00118c46;
}

Assistant:

static CURLcode libcurl_generate_mime(curl_mime *mime, int *mimeno)
{
  CURLcode ret = CURLE_OK;
  int i;
  curl_off_t size;
  curl_mimepart *part;
  char *filename;
  char *escaped = NULL;
  char *cp;
  char *data;

  /* May need several mime variables, so invent name */
  *mimeno = ++easysrc_mime_count;

  DECL1("curl_mime *mime%d;", *mimeno);
  DATA1("mime%d = NULL;", *mimeno);
  CODE1("mime%d = curl_mime_init(hnd);", *mimeno);
  CLEAN1("curl_mime_free(mime%d);", *mimeno);
  CLEAN1("mime%d = NULL;", *mimeno);
  if(mime->firstpart) {
    DECL1("curl_mimepart *part%d;", *mimeno);
    for(part = mime->firstpart; part; part = part->nextpart) {
      CODE2("part%d = curl_mime_addpart(mime%d);", *mimeno, *mimeno);
      filename = part->filename;
      switch(part->kind) {
      case MIMEKIND_FILE:
        Curl_safefree(escaped);
        escaped = c_escape(part->data, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_filedata(part%d, \"%s\");", *mimeno, escaped);
        if(!filename)
          CODE1("curl_mime_filename(part%d, NULL);", *mimeno);
        else {
          /* Fast check to see if remote file name is base name. */
          filename = part->data;
          for(cp = filename; *cp; cp++)
            if(*cp == '/' || *cp == '\\')
              filename = cp + 1;
          if(!part->filename || !strcmp(filename, part->filename))
            filename = NULL;
          else
            filename = part->filename;
        }
        break;
      case MIMEKIND_CALLBACK:
        /* Can only be reading stdin in the current context. */
        CODE1("curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
              *mimeno);
        CODE0("                  (curl_seek_callback) fseek, NULL, stdin);");
        break;
      case MIMEKIND_DATA:
#ifdef CURL_DOES_CONVERSIONS
          /* Data is stored in ASCII and we want in in the host character
             code. Convert it back for output. */
          data = malloc(part->datasize + 1);
          if(!data) {
            ret = CURLE_OUT_OF_MEMORY;
            goto nomem;
          }
          memcpy(data, part->data, part->datasize + 1);
          ret = convert_from_network(data, strlen(data));
          if(ret) {
            Curl_safefree(data);
            goto nomem;
          }
#else
        data = part->data;
#endif

        /* Are there any nul byte in data? */
        for(cp = data; *cp; cp++)
          ;
        size = (cp == data + part->datasize)? (curl_off_t) -1: part->datasize;
        Curl_safefree(escaped);
        escaped = c_escape(data, (size_t) part->datasize);
#ifdef CURL_DOES_CONVERSIONS
        Curl_safefree(data);
#endif
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        if(size >= 0)
          CODE3("curl_mime_data(part%d, \"%s\", %" CURL_FORMAT_CURL_OFF_T ");",
                                *mimeno, escaped, size);
        else
          CODE2("curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                                *mimeno, escaped);
        break;
      case MIMEKIND_MULTIPART:
        ret = libcurl_generate_mime(part->arg, &i);
        if(ret)
          goto nomem;
        CODE2("curl_mime_subparts(part%d, mime%d);", *mimeno, i);
        CODE1("mime%d = NULL;", i);   /* Avoid freeing in CLEAN sequence. */
        break;
      default:
        /* Other cases not possible in this context. */
        break;
      }

      if(part->encoder) {
        Curl_safefree(escaped);
        escaped = c_escape(part->encoder->name, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_encoder(part%d, \"%s\");", *mimeno, escaped);
      }

      if(filename) {
        Curl_safefree(escaped);
        escaped = c_escape(filename, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_filename(part%d, \"%s\");", *mimeno, escaped);
      }

      if(part->name) {
        Curl_safefree(escaped);
        escaped = c_escape(part->name, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_name(part%d, \"%s\");", *mimeno, escaped);
      }

      if(part->mimetype) {
        Curl_safefree(escaped);
        escaped = c_escape(part->mimetype, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_type(part%d, \"%s\");", *mimeno, escaped);
      }

      if(part->userheaders) {
        int ownership = part->flags & MIME_USERHEADERS_OWNER? 1: 0;

        ret = libcurl_generate_slist(part->userheaders, &i);
        if(ret)
          goto nomem;
        CODE3("curl_mime_headers(part%d, slist%d, %d);",
              *mimeno, i, ownership);
        if(ownership)
          CODE1("slist%d = NULL;", i); /* Prevent freeing in CLEAN sequence. */
      }
    }
  }

nomem:
  Curl_safefree(escaped);
  return ret;
}